

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall CfgNode::BlockData::addSignalHandler(BlockData *this,int sigid,CFG *cfg)

{
  iterator iVar1;
  mapped_type *ppCVar2;
  int local_1c;
  
  local_1c = sigid;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_CFG_*>,_std::_Select1st<std::pair<const_int,_CFG_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>
          ::find(&(this->m_signalHandlers)._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header) {
    ppCVar2 = std::map<int,_CFG_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>::
              operator[](&this->m_signalHandlers,&local_1c);
    *ppCVar2 = cfg;
  }
  else if ((iVar1._M_node[1]._M_parent)->_M_parent != (_Base_ptr)cfg->m_addr) {
    __assert_fail("it->second->addr() == cfg->addr()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                  ,0xa1,"void CfgNode::BlockData::addSignalHandler(int, CFG *)");
  }
  return;
}

Assistant:

void CfgNode::BlockData::addSignalHandler(int sigid, CFG* cfg) {
	std::map<int, CFG*>::const_iterator it = m_signalHandlers.find(sigid);
	if (it != m_signalHandlers.end()) {
		assert(it->second->addr() == cfg->addr());
	} else {
		m_signalHandlers[sigid] = cfg;
	}
}